

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_private.h
# Opt level: O0

char * ERR_getErrorName(size_t code)

{
  ERR_enum code_00;
  char *pcVar1;
  size_t in_RDI;
  
  code_00 = ERR_getErrorCode(in_RDI);
  pcVar1 = ERR_getErrorString(code_00);
  return pcVar1;
}

Assistant:

ERR_STATIC const char* ERR_getErrorName(size_t code)
{
    return ERR_getErrorString(ERR_getErrorCode(code));
}